

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

ExprBase * AnalyzeModifyAssignment(ExpressionContext *ctx,SynModifyAssignment *syntax)

{
  TypeBase *pTVar1;
  SynBase *pSVar2;
  Lexeme *pLVar3;
  FunctionLookupChain chain;
  FunctionLookupChain chain_00;
  bool bVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  SynBinaryOpType SVar8;
  SynBase *arg0;
  TypeBase *arg1;
  char *__s;
  size_t sVar9;
  ExprBase *pEVar10;
  undefined4 extraout_var;
  TypeRef *type;
  undefined4 extraout_var_00;
  VariableData *pVVar11;
  ExprBase *first;
  _func_int **pp_Var12;
  undefined4 extraout_var_03;
  ExprBase *pEVar13;
  undefined4 extraout_var_04;
  ExprBase *pEVar14;
  undefined4 extraout_var_05;
  TypeBase *pTVar15;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  SynBase *pSVar16;
  InplaceStr name;
  ArrayView<ArgumentData> arguments_00;
  ArrayView<ArgumentData> arguments_01;
  TypePair typePair;
  FunctionLookupChain function_1;
  FunctionLookupChain function;
  SmallArray<ArgumentData,_1U> arguments;
  TypePair local_e8;
  FunctionLookupChain local_d8;
  FunctionLookupChain local_c0;
  SmallArray<ArgumentData,_1U> local_a8;
  ArgumentData local_60;
  VariableHandle *variable;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  
  arg0 = (SynBase *)AnalyzeExpression(ctx,syntax->lhs);
  arg1 = (TypeBase *)AnalyzeExpression(ctx,syntax->rhs);
  pTVar15 = (TypeBase *)arg0->end;
  if (((pTVar15 == (TypeBase *)0x0) || (pTVar15->typeID != 0)) &&
     ((pTVar1 = (TypeBase *)(arg1->name).end, pTVar1 == (TypeBase *)0x0 || (pTVar1->typeID != 0))))
  {
    uVar5 = *(int *)&(syntax->super_SynBase).field_0x3c - 1;
    local_e8.a = pTVar15;
    local_e8.b = pTVar1;
    if (10 < uVar5) {
LAB_0015a928:
      __assert_fail("index < N",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                    ,0x115,
                    "T &FixedArray<SmallDenseSet<TypePair, TypePairHasher, 4>, 11>::operator[](unsigned int) [T = SmallDenseSet<TypePair, TypePairHasher, 4>, N = 11]"
                   );
    }
    bVar4 = SmallDenseSet<TypePair,_TypePairHasher,_4U>::contains
                      ((ctx->noModifyOperatorForTypePair).data + uVar5,&local_e8);
    if (!bVar4) {
      __s = GetOpName(*(SynModifyAssignType *)&(syntax->super_SynBase).field_0x3c);
      sVar9 = strlen(__s);
      name.end = __s + sVar9;
      name.begin = __s;
      pEVar10 = CreateFunctionCall2(ctx,&syntax->super_SynBase,name,(ExprBase *)arg0,
                                    (ExprBase *)arg1,true,false,true);
      if (pEVar10 != (ExprBase *)0x0) {
        return pEVar10;
      }
      uVar5 = *(int *)&(syntax->super_SynBase).field_0x3c - 1;
      if (10 < uVar5) goto LAB_0015a928;
      SmallDenseSet<TypePair,_TypePairHasher,_4U>::insert
                ((ctx->noModifyOperatorForTypePair).data + uVar5,&local_e8);
    }
    uVar5 = arg0->typeID;
    if (uVar5 == 0x16) {
      pSVar16 = arg0->next;
LAB_0015a539:
      pTVar15 = (TypeBase *)pSVar16->end;
      if ((pTVar15 != (TypeBase *)0x0) && (pTVar15->typeID == 0x12)) {
        pVVar11 = anon_unknown.dwarf_9c70f::AllocateTemporary(ctx,&syntax->super_SynBase,pTVar15);
        SVar8 = SYN_BINARY_OP_UNKNOWN;
        pEVar10 = CreateVariableAccess(ctx,&syntax->super_SynBase,pVVar11,false);
        pEVar10 = CreateAssignment(ctx,&syntax->super_SynBase,pEVar10,(ExprBase *)pSVar16);
        iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
        first = (ExprBase *)CONCAT44(extraout_var_01,iVar6);
        pTVar15 = ctx->typeVoid;
        iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
        pp_Var12 = (_func_int **)CONCAT44(extraout_var_02,iVar6);
        *pp_Var12 = (_func_int *)0x0;
        pp_Var12[1] = (_func_int *)pVVar11;
        pp_Var12[2] = (_func_int *)0x0;
        *(undefined1 *)(pp_Var12 + 3) = 0;
        first->typeID = 0x1e;
        first->source = &syntax->super_SynBase;
        first->type = pTVar15;
        first->next = (ExprBase *)0x0;
        first->listed = false;
        first->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223a58;
        first[1]._vptr_ExprBase = pp_Var12;
        *(ExprBase **)&first[1].typeID = pEVar10;
        iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
        pEVar10 = (ExprBase *)CONCAT44(extraout_var_03,iVar6);
        pTVar15 = (TypeBase *)arg0->end;
        pEVar13 = CreateVariableAccess(ctx,&syntax->super_SynBase,pVVar11,false);
        pEVar10->typeID = 0x16;
        pEVar10->source = &syntax->super_SynBase;
        pEVar10->type = pTVar15;
        pEVar10->next = (ExprBase *)0x0;
        pEVar10->listed = false;
        pEVar10->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223a90;
        pEVar10[1]._vptr_ExprBase = (_func_int **)pEVar13;
        uVar5 = *(int *)&(syntax->super_SynBase).field_0x3c - 1;
        if (uVar5 < 0xb) {
          SVar8 = *(SynBinaryOpType *)(&DAT_001e1290 + (ulong)uVar5 * 4);
        }
        pEVar10 = CreateBinaryOp(ctx,&syntax->super_SynBase,SVar8,pEVar10,(ExprBase *)arg1);
        if ((pEVar10->type == (TypeBase *)0x0) || (pEVar10->type->typeID != 0)) {
          iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
          pEVar13 = (ExprBase *)CONCAT44(extraout_var_04,iVar6);
          pTVar15 = (TypeBase *)arg0->end;
          pEVar14 = CreateVariableAccess(ctx,&syntax->super_SynBase,pVVar11,false);
          pEVar13->typeID = 0x16;
          pEVar13->source = &syntax->super_SynBase;
          pEVar13->type = pTVar15;
          pEVar13->next = (ExprBase *)0x0;
          pEVar13->listed = false;
          pEVar13->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223a90;
          pEVar13[1]._vptr_ExprBase = (_func_int **)pEVar14;
          pEVar10 = CreateAssignment(ctx,&syntax->super_SynBase,pEVar13,pEVar10);
          pEVar10 = CreateSequence(ctx,&syntax->super_SynBase,first,pEVar10);
          return pEVar10;
        }
        goto LAB_0015a729;
      }
      anon_unknown.dwarf_9c70f::Report
                (ctx,&syntax->super_SynBase,"ERROR: cannot change immutable value of type %.*s",
                 (ulong)(uint)(*(int *)&(((TypeBase *)arg0->end)->name).end -
                              (int)(((TypeBase *)arg0->end)->name).begin));
      iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
      pEVar10 = (ExprBase *)CONCAT44(extraout_var_06,iVar6);
      pTVar15 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
      pEVar10->typeID = 0;
      pEVar10->source = &syntax->super_SynBase;
      pEVar10->type = pTVar15;
      pEVar10->next = (ExprBase *)0x0;
      pEVar10->listed = false;
      pEVar10->_vptr_ExprBase = (_func_int **)&PTR__ExprError_00223b38;
      pEVar10[2]._vptr_ExprBase = (_func_int **)0x0;
    }
    else {
      pSVar16 = arg0;
      if (uVar5 != 0x29) {
        if (uVar5 == 0x22) {
          iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
          pSVar16 = (SynBase *)arg0->begin;
          type = ExpressionContext::GetReferenceType(ctx,(TypeBase *)arg0->end);
          iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
          variable = (VariableHandle *)CONCAT44(extraout_var_00,iVar7);
          pVVar11 = (VariableData *)arg0->next;
          variable->source = (SynBase *)arg0->begin;
          variable->variable = pVVar11;
          variable->next = (VariableHandle *)0x0;
          variable->listed = false;
          ExprGetAddress::ExprGetAddress
                    ((ExprGetAddress *)CONCAT44(extraout_var,iVar6),pSVar16,&type->super_TypeBase,
                     variable);
          pSVar16 = (SynBase *)CONCAT44(extraout_var,iVar6);
        }
        goto LAB_0015a539;
      }
      pSVar2 = arg0->next;
      if ((((pSVar2 == (SynBase *)0x0) || (pSVar2->typeID != 0x26)) ||
          (pSVar2->next == (SynBase *)0x0)) ||
         (*(char *)((long)&(pSVar2->next->pos).begin + 1) != '\x01')) goto LAB_0015a539;
      SVar8 = anon_unknown.dwarf_9c70f::GetBinaryOpType
                        (*(SynModifyAssignType *)&(syntax->super_SynBase).field_0x3c);
      local_60.value =
           CreateBinaryOp(ctx,&syntax->super_SynBase,SVar8,(ExprBase *)arg0,(ExprBase *)arg1);
      if (((local_60.value)->type == (TypeBase *)0x0) || ((local_60.value)->type->typeID != 0)) {
        local_a8.allocator = ctx->allocator;
        local_a8.data = local_a8.little;
        local_a8.little[0].source = (SynBase *)0x0;
        local_a8.little[0].isExplicit = false;
        local_a8.little[0].name = (SynIdentifier *)0x0;
        local_a8.little[0].type = (TypeBase *)0x0;
        local_a8.little[0].value = (ExprBase *)0x0;
        local_a8.little[0].valueFunction = (FunctionData *)0x0;
        local_a8.count = 0;
        local_a8.max = 1;
        local_60.type = (local_60.value)->type;
        local_60.isExplicit = false;
        local_60.name = (SynIdentifier *)0x0;
        local_60.valueFunction = (FunctionData *)0x0;
        local_60.source = &syntax->super_SynBase;
        SmallArray<ArgumentData,_1U>::push_back(&local_a8,&local_60);
        anon_unknown.dwarf_9c70f::LookupFunctionChainByName
                  (&local_c0,ctx,*(uint *)&pSVar2->next[1]._vptr_SynBase);
        if (local_c0.node.node != (Node *)0x0) {
          chain.node.node._0_4_ = (int)local_c0.node.node;
          chain.node.start = local_c0.node.start;
          chain.node.node._4_4_ = (int)((ulong)local_c0.node.node >> 0x20);
          chain.scope._0_4_ = (int)local_c0.scope;
          chain.scope._4_4_ = (int)((ulong)local_c0.scope >> 0x20);
          pEVar10 = CreateFunctionAccess
                              (ctx,&syntax->super_SynBase,chain,*(ExprBase **)&pSVar2->listed);
          arguments_00.count = local_a8.count;
          arguments_00.data = local_a8.data;
          arguments_00._12_4_ = 0;
          pEVar10 = CreateFunctionCall(ctx,&syntax->super_SynBase,pEVar10,arguments_00,true);
          if (pEVar10 != (ExprBase *)0x0) {
            SmallArray<ArgumentData,_1U>::~SmallArray(&local_a8);
            return pEVar10;
          }
        }
        pLVar3 = pSVar2->next[5].end;
        if ((pLVar3 == (Lexeme *)0x0) ||
           (anon_unknown.dwarf_9c70f::LookupFunctionChainByName(&local_d8,ctx,pLVar3[2].type),
           local_d8.node.node == (Node *)0x0)) {
          SmallArray<ArgumentData,_1U>::~SmallArray(&local_a8);
        }
        else {
          chain_00.node.node._0_4_ = (int)local_d8.node.node;
          chain_00.node.start = local_d8.node.start;
          chain_00.node.node._4_4_ = (int)((ulong)local_d8.node.node >> 0x20);
          chain_00.scope._0_4_ = (int)local_d8.scope;
          chain_00.scope._4_4_ = (int)((ulong)local_d8.scope >> 0x20);
          pEVar10 = CreateFunctionAccess
                              (ctx,&syntax->super_SynBase,chain_00,*(ExprBase **)&pSVar2->listed);
          arguments_01.count = local_a8.count;
          arguments_01.data = local_a8.data;
          arguments_01._12_4_ = 0;
          pEVar10 = CreateFunctionCall(ctx,&syntax->super_SynBase,pEVar10,arguments_01,true);
          SmallArray<ArgumentData,_1U>::~SmallArray(&local_a8);
          if (pEVar10 != (ExprBase *)0x0) {
            return pEVar10;
          }
        }
        goto LAB_0015a539;
      }
      iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
      pEVar10 = (ExprBase *)CONCAT44(extraout_var_07,iVar6);
      pTVar15 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
      pEVar10->typeID = 0;
      pEVar10->source = &syntax->super_SynBase;
      pEVar10->type = pTVar15;
      pEVar10->next = (ExprBase *)0x0;
      pEVar10->listed = false;
      pEVar10->_vptr_ExprBase = (_func_int **)&PTR__ExprError_00223b38;
      pEVar10[2]._vptr_ExprBase = (_func_int **)0x0;
    }
    pEVar10[1]._vptr_ExprBase = (_func_int **)&pEVar10[1].source;
    pEVar10[1].source = arg0;
    *(undefined8 *)&pEVar10[1].typeID = 0x400000002;
    pEVar10[1].type = arg1;
  }
  else {
LAB_0015a729:
    iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
    pEVar10 = (ExprBase *)CONCAT44(extraout_var_05,iVar6);
    pTVar15 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
    pEVar10->typeID = 0;
    pEVar10->source = &syntax->super_SynBase;
    pEVar10->type = pTVar15;
    pEVar10->next = (ExprBase *)0x0;
    pEVar10->listed = false;
    pEVar10->_vptr_ExprBase = (_func_int **)&PTR__ExprError_00223b38;
    pEVar10[2]._vptr_ExprBase = (_func_int **)0x0;
    pEVar10[1]._vptr_ExprBase = (_func_int **)&pEVar10[1].source;
    pEVar10[1].source = arg0;
    *(undefined8 *)&pEVar10[1].typeID = 0x400000002;
    pEVar10[1].type = arg1;
  }
  return pEVar10;
}

Assistant:

ExprBase* AnalyzeModifyAssignment(ExpressionContext &ctx, SynModifyAssignment *syntax)
{
	ExprBase *lhs = AnalyzeExpression(ctx, syntax->lhs);
	ExprBase *rhs = AnalyzeExpression(ctx, syntax->rhs);

	if(isType<TypeError>(lhs->type) || isType<TypeError>(rhs->type))
		return new (ctx.get<ExprError>()) ExprError(syntax, ctx.GetErrorType(), lhs, rhs);

	TypePair typePair(lhs->type, rhs->type);

	if(!ctx.noModifyOperatorForTypePair[int(syntax->type) - 1].contains(typePair))
	{
		if(ExprBase *result = CreateFunctionCall2(ctx, syntax, InplaceStr(GetOpName(syntax->type)), lhs, rhs, true, false, true))
			return result;
		else
			ctx.noModifyOperatorForTypePair[int(syntax->type) - 1].insert(typePair);
	}

	// Unwrap modifiable pointer
	ExprBase* wrapped = lhs;

	if(ExprVariableAccess *node = getType<ExprVariableAccess>(lhs))
	{
		wrapped = new (ctx.get<ExprGetAddress>()) ExprGetAddress(lhs->source, ctx.GetReferenceType(lhs->type), new (ctx.get<VariableHandle>()) VariableHandle(node->source, node->variable));
	}
	else if(ExprDereference *node = getType<ExprDereference>(lhs))
	{
		wrapped = node->value;
	}
	else if(ExprFunctionCall *node = getType<ExprFunctionCall>(lhs))
	{
		// Will try to transform 'get' accessor to 'set'
		if(ExprFunctionAccess *access = getType<ExprFunctionAccess>(node->function))
		{
			if(access->function && access->function->accessor)
			{
				ExprBase *result = CreateBinaryOp(ctx, syntax, GetBinaryOpType(syntax->type), lhs, rhs);

				if(isType<TypeError>(result->type))
					return new (ctx.get<ExprError>()) ExprError(syntax, ctx.GetErrorType(), lhs, rhs);

				SmallArray<ArgumentData, 1> arguments(ctx.allocator);
				arguments.push_back(ArgumentData(syntax, false, NULL, result->type, result));

				if(FunctionLookupChain function = LookupFunctionChainByName(ctx, access->function->nameHash))
				{
					ExprBase *overloads = CreateFunctionAccess(ctx, syntax, function, access->context);

					if(ExprBase *call = CreateFunctionCall(ctx, syntax, overloads, arguments, true))
						return call;
				}

				if(FunctionData *proto = access->function->proto)
				{
					if(FunctionLookupChain function = LookupFunctionChainByName(ctx, proto->nameHash))
					{
						ExprBase *overloads = CreateFunctionAccess(ctx, syntax, function, access->context);

						if(ExprBase *call = CreateFunctionCall(ctx, syntax, overloads, arguments, true))
							return call;
					}
				}
			}
		}
	}

	TypeRef *typeRef = getType<TypeRef>(wrapped->type);

	if(!typeRef)
	{
		Report(ctx, syntax, "ERROR: cannot change immutable value of type %.*s", FMT_ISTR(lhs->type->name));

		return new (ctx.get<ExprError>()) ExprError(syntax, ctx.GetErrorType(), lhs, rhs);
	}

	VariableData *storage = AllocateTemporary(ctx, syntax, wrapped->type);

	ExprBase *assignment = CreateAssignment(ctx, syntax, CreateVariableAccess(ctx, syntax, storage, false), wrapped);

	ExprBase *definition = new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(syntax, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, storage), assignment);

	ExprBase *lhsValue = new (ctx.get<ExprDereference>()) ExprDereference(syntax, lhs->type, CreateVariableAccess(ctx, syntax, storage, false));

	ExprBase *result = CreateBinaryOp(ctx, syntax, GetBinaryOpType(syntax->type), lhsValue, rhs);

	if(isType<TypeError>(result->type))
		return new (ctx.get<ExprError>()) ExprError(syntax, ctx.GetErrorType(), lhs, rhs);

	return CreateSequence(ctx, syntax, definition, CreateAssignment(ctx, syntax, new (ctx.get<ExprDereference>()) ExprDereference(syntax, lhs->type, CreateVariableAccess(ctx, syntax, storage, false)), result));
}